

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O0

lzma_ret validate_chain(lzma_filter *filters,size_t *count)

{
  long local_40;
  size_t j;
  size_t i;
  _Bool last_ok;
  ulong uStack_28;
  _Bool non_last_ok;
  size_t changes_size_count;
  size_t *count_local;
  lzma_filter *filters_local;
  
  if ((filters == (lzma_filter *)0x0) || (filters->id == 0xffffffffffffffff)) {
    filters_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    uStack_28 = 0;
    i._7_1_ = 1;
    j = 0;
    do {
      for (local_40 = 0; filters[j].id != features[local_40].id; local_40 = local_40 + 1) {
        if (features[local_40].id == 0xffffffffffffffff) {
          return LZMA_OPTIONS_ERROR;
        }
      }
      if (i._7_1_ == 0) {
        return LZMA_OPTIONS_ERROR;
      }
      i._7_1_ = features[local_40].non_last_ok & 1;
      uStack_28 = (features[local_40].changes_size & 1) + uStack_28;
      j = j + 1;
    } while (filters[j].id != 0xffffffffffffffff);
    if (((j < 5) && ((features[local_40].last_ok & 1U) != 0)) && (uStack_28 < 4)) {
      *count = j;
      filters_local._4_4_ = LZMA_OK;
    }
    else {
      filters_local._4_4_ = LZMA_OPTIONS_ERROR;
    }
  }
  return filters_local._4_4_;
}

Assistant:

static lzma_ret
validate_chain(const lzma_filter *filters, size_t *count)
{
	// There must be at least one filter.
	if (filters == NULL || filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	// Number of non-last filters that may change the size of the data
	// significantly (that is, more than 1-2 % or so).
	size_t changes_size_count = 0;

	// True if it is OK to add a new filter after the current filter.
	bool non_last_ok = true;

	// True if the last filter in the given chain is actually usable as
	// the last filter. Only filters that support embedding End of Payload
	// Marker can be used as the last filter in the chain.
	bool last_ok = false;

	size_t i = 0;
	do {
		size_t j;
		for (j = 0; filters[i].id != features[j].id; ++j)
			if (features[j].id == LZMA_VLI_UNKNOWN)
				return LZMA_OPTIONS_ERROR;

		// If the previous filter in the chain cannot be a non-last
		// filter, the chain is invalid.
		if (!non_last_ok)
			return LZMA_OPTIONS_ERROR;

		non_last_ok = features[j].non_last_ok;
		last_ok = features[j].last_ok;
		changes_size_count += features[j].changes_size;

	} while (filters[++i].id != LZMA_VLI_UNKNOWN);

	// There must be 1-4 filters. The last filter must be usable as
	// the last filter in the chain. A maximum of three filters are
	// allowed to change the size of the data.
	if (i > LZMA_FILTERS_MAX || !last_ok || changes_size_count > 3)
		return LZMA_OPTIONS_ERROR;

	*count = i;
	return LZMA_OK;
}